

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O2

void __thiscall
QtMWidgets::DateTimePicker::DateTimePicker
          (DateTimePicker *this,QVariant *val,Type parserType,QWidget *parent)

{
  int iVar1;
  undefined4 uVar2;
  DateTimePickerPrivate *this_00;
  QSizePolicy type;
  QMetaType local_58;
  undefined8 uStack_50;
  QTime local_44;
  undefined1 local_40 [8];
  undefined1 local_38 [16];
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
  local_28;
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_001ad4d8;
  *(undefined ***)&this->field_0x10 = &PTR__DateTimePicker_001ad688;
  this_00 = (DateTimePickerPrivate *)operator_new(0xa8);
  DateTimePickerPrivate::DateTimePickerPrivate(this_00,this,parserType);
  (this->d).d = this_00;
  type.field_0 = SUB84(this,0);
  QWidget::setSizePolicy(type);
  local_58.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
  iVar1 = QMetaType::id(&local_58,0);
  if (iVar1 == 0xe) {
    local_58.d_ptr = (QMetaTypeInterface *)QVariant::toDate();
    setDate(this,(QDate *)&local_58);
  }
  else if (iVar1 == 0xf) {
    uVar2 = QVariant::toTime();
    local_58.d_ptr._0_4_ = uVar2;
    setTime(this,(QTime *)&local_58);
  }
  else {
    if (iVar1 == 0x10) {
      QVariant::toDateTime();
      setDateTime(this,(QDateTime *)&local_58);
    }
    else {
      QDate::QDate((QDate *)&local_28,2000,1,1);
      QTime::QTime(&local_44,0,0,0,0);
      QDateTime::QDateTime((QDateTime *)&local_58,(QDate)local_28.d,local_44,LocalTime,0);
      setDateTime(this,(QDateTime *)&local_58);
    }
    QDateTime::~QDateTime((QDateTime *)&local_58);
  }
  local_58.d_ptr = (QMetaTypeInterface *)_q_scrollAboutToStart;
  uStack_50 = 0;
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::DateTimePicker::*)()>
            ((Object *)(local_38 + 8),(offset_in_Scroller_to_subr)((this->d).d)->scroller,
             (Object *)Scroller::aboutToStart,0,(ConnectionType)type.field_0);
  QMetaObject::Connection::~Connection((Connection *)(local_38 + 8));
  local_58.d_ptr = (QMetaTypeInterface *)_q_scroll;
  uStack_50 = 0;
  QObject::
  connect<void(QtMWidgets::Scroller::*)(int,int),void(QtMWidgets::DateTimePicker::*)(int,int)>
            ((Object *)local_38,(offset_in_Scroller_to_subr)((this->d).d)->scroller,
             (Object *)Scroller::scroll,0,(ConnectionType)type.field_0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  local_58.d_ptr = (QMetaTypeInterface *)_q_scrollFinished;
  uStack_50 = 0;
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::DateTimePicker::*)()>
            ((Object *)local_40,(offset_in_Scroller_to_subr)((this->d).d)->scroller,
             (Object *)Scroller::finished,0,(ConnectionType)type.field_0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  return;
}

Assistant:

DateTimePicker::DateTimePicker( const QVariant & val, QMetaType::Type parserType,
	QWidget * parent )
	:	QWidget( parent )
	,	d( new DateTimePickerPrivate( this, parserType ) )
{
	setSizePolicy( QSizePolicy( QSizePolicy::Fixed,
		QSizePolicy::Fixed ) );

	switch( val.metaType().id() )
	{
		case QMetaType::QDate :
			setDate( val.toDate() );
			break;

		case QMetaType::QTime :
			setTime( val.toTime() );
			break;

		case QMetaType::QDateTime :
			setDateTime( val.toDateTime() );
			break;

		default :
			setDateTime( QDateTime( DATETIMEPICKER_DATE_INITIAL,
				DATETIMEPICKER_TIME_MIN ) );
	}

	connect( d->scroller, &Scroller::aboutToStart,
		this, &DateTimePicker::_q_scrollAboutToStart );

	connect( d->scroller, &Scroller::scroll,
		this, &DateTimePicker::_q_scroll );

	connect( d->scroller, &Scroller::finished,
		this, &DateTimePicker::_q_scrollFinished );
}